

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignalsImpl::ValidationSignalsImpl
          (ValidationSignalsImpl *this,
          unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
          *task_runner)

{
  long lVar1;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffd0;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff98);
  std::__cxx11::
  list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>::list
            ((list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
              *)in_stack_ffffffffffffff98);
  std::
  unordered_map<CValidationInterface_*,_std::_List_iterator<ValidationSignalsImpl::ListEntry>,_std::hash<CValidationInterface_*>,_std::equal_to<CValidationInterface_*>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>_>
  ::unordered_map(in_stack_ffffffffffffff98);
  inline_assertion_check<true,std::unique_ptr<util::TaskRunnerInterface,std::default_delete<util::TaskRunnerInterface>>&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (int)((ulong)(in_RDI + 0x78) >> 0x20),in_RSI,in_RDI);
  std::unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
  unique_ptr((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
              *)in_stack_ffffffffffffff98,
             (unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
              *)0x85da72);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit ValidationSignalsImpl(std::unique_ptr<util::TaskRunnerInterface> task_runner)
        : m_task_runner{std::move(Assert(task_runner))} {}